

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O0

void convolve_vert(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                  InterpKernel *y_filters,int y0_q4,int y_step_q4,int w,int h)

{
  uint8_t uVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  int in_stack_00000008;
  int sum;
  int16_t *y_filter;
  uchar *src_y;
  int y;
  int y_q4;
  int x;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined8 local_18;
  undefined8 local_8;
  
  local_8 = in_RDI + in_RSI * -3;
  local_18 = in_RDX;
  for (local_30 = 0; local_30 < (int)y_filter; local_30 = local_30 + 1) {
    local_34 = in_R9D;
    for (local_38 = 0; local_38 < (int)src_y; local_38 = local_38 + 1) {
      iVar2 = vert_scalar_product((uint8_t *)(local_8 + ((int)local_34 >> 4) * in_RSI),in_RSI,
                                  (int16_t *)(in_R8 + (long)(int)(local_34 & 0xf) * 0x10));
      uVar1 = clip_pixel(iVar2 + 0x40 >> 7);
      *(uint8_t *)(local_18 + local_38 * in_RCX) = uVar1;
      local_34 = in_stack_00000008 + local_34;
    }
    local_8 = local_8 + 1;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

static void convolve_vert(const uint8_t *src, ptrdiff_t src_stride,
                          uint8_t *dst, ptrdiff_t dst_stride,
                          const InterpKernel *y_filters, int y0_q4,
                          int y_step_q4, int w, int h) {
  src -= src_stride * (SUBPEL_TAPS / 2 - 1);

  for (int x = 0; x < w; ++x) {
    int y_q4 = y0_q4;
    for (int y = 0; y < h; ++y) {
      const unsigned char *src_y = &src[(y_q4 >> SUBPEL_BITS) * src_stride];
      const int16_t *const y_filter = y_filters[y_q4 & SUBPEL_MASK];
      const int sum = vert_scalar_product(src_y, src_stride, y_filter);
      dst[y * dst_stride] = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
      y_q4 += y_step_q4;
    }
    ++src;
    ++dst;
  }
}